

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O0

time_t cov::timer::time(time_t *__timer)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__rhs;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__lhs;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff68;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff78;
  duration<long,_std::ratio<60L,_1L>_> local_78;
  undefined8 local_70;
  rep local_68;
  duration<long,_std::ratio<1L,_1L>_> local_60;
  undefined8 local_58;
  rep local_50;
  duration<long,_std::ratio<1L,_1000L>_> local_48;
  undefined8 local_40;
  rep local_38;
  duration<long,_std::ratio<1L,_1000000L>_> local_30;
  undefined8 local_28;
  rep local_20;
  duration<long,_std::ratio<1L,_1000000000L>_> local_18;
  undefined4 local_c;
  rep local_8;
  
  local_c = SUB84(__timer,0);
  __rhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *)((ulong)__timer & 0xffffffff);
  switch(__rhs) {
  case (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        *)0x0:
    local_28 = std::chrono::_V2::system_clock::now();
    local_20 = (rep)std::chrono::operator-(in_stack_ffffffffffffff78,__rhs);
    local_18.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_ffffffffffffff68);
    local_8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_18);
    break;
  case (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        *)0x1:
    local_40 = std::chrono::_V2::system_clock::now();
    local_38 = (rep)std::chrono::operator-(in_stack_ffffffffffffff78,__rhs);
    local_30.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_ffffffffffffff68);
    local_8 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_30);
    break;
  case (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        *)0x2:
    local_58 = std::chrono::_V2::system_clock::now();
    local_50 = (rep)std::chrono::operator-(in_stack_ffffffffffffff78,__rhs);
    local_48.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_ffffffffffffff68);
    local_8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_48);
    break;
  case (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        *)0x3:
    local_70 = std::chrono::_V2::system_clock::now();
    local_68 = (rep)std::chrono::operator-(in_stack_ffffffffffffff78,__rhs);
    local_60.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_ffffffffffffff68);
    local_8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_60);
    break;
  case (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        *)0x4:
    __lhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             *)std::chrono::_V2::system_clock::now();
    std::chrono::operator-(__lhs,__rhs);
    local_78.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_ffffffffffffff68);
    local_8 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_78);
    break;
  default:
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static timer_t time(time_unit unit)
		{
			switch (unit) {
			case time_unit::nano_sec:
				return std::chrono::duration_cast<std::chrono::nanoseconds>(
				           std::chrono::high_resolution_clock::now() - m_timer).count();
			case time_unit::micro_sec:
				return std::chrono::duration_cast<std::chrono::microseconds>(
				           std::chrono::high_resolution_clock::now() - m_timer).count();
			case time_unit::milli_sec:
				return std::chrono::duration_cast<std::chrono::milliseconds>(
				           std::chrono::high_resolution_clock::now() - m_timer).count();
			case time_unit::second:
				return std::chrono::duration_cast<std::chrono::seconds>(
				           std::chrono::high_resolution_clock::now() - m_timer).count();
			case time_unit::minute:
				return std::chrono::duration_cast<std::chrono::minutes>(
				           std::chrono::high_resolution_clock::now() - m_timer).count();
			}
			return 0;
		}